

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSync(Pager *pPager,char *zMaster)

{
  void *pArg;
  int rc;
  char *zMaster_local;
  Pager *pPager_local;
  
  pArg._4_4_ = sqlite3OsFileControl(pPager->fd,0x15,zMaster);
  if (pArg._4_4_ == 0xc) {
    pArg._4_4_ = 0;
  }
  if ((pArg._4_4_ == 0) && (pPager->noSync == '\0')) {
    pArg._4_4_ = sqlite3OsSync(pPager->fd,(uint)pPager->syncFlags);
  }
  return pArg._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSync(Pager *pPager, const char *zMaster){
  int rc = SQLITE_OK;
  void *pArg = (void*)zMaster;
  rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_SYNC, pArg);
  if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
  if( rc==SQLITE_OK && !pPager->noSync ){
    assert( !MEMDB );
    rc = sqlite3OsSync(pPager->fd, pPager->syncFlags);
  }
  return rc;
}